

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *
nonius::
filter_benchmarks<__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
          (__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
           first,__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
                 last,string *pattern)

{
  back_insert_iterator<std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_> __pred;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  in_RCX;
  back_insert_iterator<std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_> in_RDI;
  regex matcher;
  vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *r;
  vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *in_stack_ffffffffffffff58;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  __last;
  undefined8 in_stack_ffffffffffffff90;
  flag_type __f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffa0;
  
  __f = (flag_type)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  *(undefined8 *)&((benchmark *)in_RDI.container)->name = 0;
  (((benchmark *)in_RDI.container)->name)._M_string_length = 0;
  (((benchmark *)in_RDI.container)->name).field_2._M_allocated_capacity = 0;
  __last._M_current = (benchmark *)in_RDI.container;
  std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::vector
            ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)0x218264);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,__f);
  __pred = std::back_inserter<std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>
                     (in_stack_ffffffffffffff58);
  std::
  copy_if<__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,std::back_insert_iterator<std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,nonius::filter_benchmarks<__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>(__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,std::__cxx11::string)::_lambda(nonius::benchmark_const&)_1_>
            (in_RCX,__last,in_RDI,(anon_class_8_1_b578bc12)__pred.container);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)__pred.container);
  return (vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)__last._M_current;
}

Assistant:

std::vector<benchmark> filter_benchmarks(Iterator first, Iterator last, std::string pattern) {
        auto r = std::vector<benchmark>{};
        auto matcher = std::regex{pattern};
        std::copy_if(first, last, std::back_inserter(r), [&] (benchmark const& b) {
            return std::regex_match(b.name, matcher);
        });
        return r;
    }